

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::printTrainingHelp(Args *this)

{
  ostream *poVar1;
  Args *this_00;
  long in_RDI;
  undefined8 in_stack_ffffffffffffff60;
  loss_name ln;
  Args *in_stack_ffffffffffffff68;
  string local_58 [48];
  string local_28 [40];
  
  ln = (loss_name)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for training are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -lr                 learning rate [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x78));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -lrUpdateRate       change the rate of updates for the learning rate ["
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x80));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -dim                size of word vectors [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x84));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -ws                 size of the context window [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x88));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -epoch              number of epochs [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x8c));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -neg                number of negatives sampled [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x98));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -loss               loss function {ns, hs, softmax, one-vs-all} [");
  lossToString_abi_cxx11_(in_stack_ffffffffffffff68,ln);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -thread             number of threads (set to 1 to ensure reproducible results) ["
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xb4));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -pretrainedVectors  pretrained word vectors for supervised learning ["
                          );
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0xe8));
  this_00 = (Args *)std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<((ostream *)this_00,
                           "  -saveOutput         whether output params should be saved [");
  boolToString_abi_cxx11_(this_00,SUB81((ulong)poVar1 >> 0x38,0));
  poVar1 = std::operator<<(poVar1,local_58);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -seed               random generator seed  [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x10c));
  std::operator<<(poVar1,"]\n");
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Args::printTrainingHelp() {
  std::cerr
      << "\nThe following arguments for training are optional:\n"
      << "  -lr                 learning rate [" << lr << "]\n"
      << "  -lrUpdateRate       change the rate of updates for the learning rate ["
      << lrUpdateRate << "]\n"
      << "  -dim                size of word vectors [" << dim << "]\n"
      << "  -ws                 size of the context window [" << ws << "]\n"
      << "  -epoch              number of epochs [" << epoch << "]\n"
      << "  -neg                number of negatives sampled [" << neg << "]\n"
      << "  -loss               loss function {ns, hs, softmax, one-vs-all} ["
      << lossToString(loss) << "]\n"
      << "  -thread             number of threads (set to 1 to ensure reproducible results) ["
      << thread << "]\n"
      << "  -pretrainedVectors  pretrained word vectors for supervised learning ["
      << pretrainedVectors << "]\n"
      << "  -saveOutput         whether output params should be saved ["
      << boolToString(saveOutput) << "]\n"
      << "  -seed               random generator seed  [" << seed << "]\n";
}